

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::CopyInfo::Deserialize(CopyInfo *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  CopyInfo *this_00;
  pointer pCVar4;
  pointer *__ptr;
  byte bVar5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> result;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_58;
  undefined1 local_50 [32];
  int iVar3;
  
  this_00 = (CopyInfo *)operator_new(0x110);
  CopyInfo(this_00);
  local_58._M_head_impl = this_00;
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"catalog");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pCVar4->catalog,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d08b4;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->catalog,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d08b4:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"schema");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pCVar4->schema,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d0950;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->schema,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d0950:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"table");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pCVar4->table,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d09ec;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->table,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d09ec:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcb,"select_list",&pCVar4->select_list);
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"is_from");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pCVar4->is_from = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"format");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pCVar4->format,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d0af5;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->format,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d0af5:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xce,"file_path");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pCVar4->file_path,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d0b94;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->file_path,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d0b94:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::vector<duckdb::Value,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>>>
            (deserializer,0xcf,"options",&pCVar4->options);
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_58);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd0,"select_statement");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pCVar4->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar4->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 0;
      goto LAB_005d0c6f;
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var7._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_50,deserializer);
      _Var7._M_head_impl = (QueryNode *)local_50._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pCVar4->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar4->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 1;
      goto LAB_005d0c6f;
    }
  }
  (*(_Var6._M_head_impl)->_vptr_QueryNode[1])();
LAB_005d0c6f:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> CopyInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CopyInfo>(new CopyInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(202, "table", result->table);
	deserializer.ReadPropertyWithDefault<vector<string>>(203, "select_list", result->select_list);
	deserializer.ReadPropertyWithDefault<bool>(204, "is_from", result->is_from);
	deserializer.ReadPropertyWithDefault<string>(205, "format", result->format);
	deserializer.ReadPropertyWithDefault<string>(206, "file_path", result->file_path);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<vector<Value>>>(207, "options", result->options);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(208, "select_statement", result->select_statement);
	return std::move(result);
}